

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O0

int zt_opt_bool_int(int argn,int defn,int *argc,char **argv,zt_opt_def_t *def,zt_opt_error error)

{
  char cVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  long in_RCX;
  int in_ESI;
  int in_EDI;
  char **in_R8;
  zt_opt_def_t *in_R9;
  char *arg;
  int args_consumed;
  size_t len;
  int result;
  zt_opt_error in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 uVar4;
  
  __s = zt_opt_get_value((int)((ulong)in_RCX >> 0x20),(int)in_RCX,in_R8,in_R9,
                         (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         in_stack_ffffffffffffffc0);
  sVar3 = strlen(__s);
  if (sVar3 != 1) {
    iVar2 = strcasecmp(__s,"true");
    if ((iVar2 == 0) || (iVar2 = strcasecmp(__s,"yes"), iVar2 == 0)) {
      uVar4 = 1;
    }
    else {
      iVar2 = strcasecmp(__s,"false");
      if ((iVar2 != 0) && (iVar2 = strcasecmp(__s,"no"), iVar2 != 0)) {
        (*(code *)in_R9)(0x16,"\'%s\' is not a boolean expression",
                         *(undefined8 *)(in_RCX + (long)in_EDI * 8));
        return 0;
      }
      uVar4 = 0;
    }
    goto LAB_00147def;
  }
  cVar1 = *__s;
  if ((cVar1 == 'F') || (cVar1 == 'N')) {
LAB_00147d13:
    uVar4 = 0;
  }
  else {
    if ((cVar1 != 'T') && (cVar1 != 'Y')) {
      if ((cVar1 == 'f') || (cVar1 == 'n')) goto LAB_00147d13;
      if ((cVar1 != 't') && (cVar1 != 'y')) {
        (*(code *)in_R9)(0x16,"\'%s\' is not a boolean expression",
                         *(undefined8 *)(in_RCX + (long)in_EDI * 8));
        return 0;
      }
    }
    uVar4 = 1;
  }
LAB_00147def:
  if (in_R8[(long)in_ESI * 6 + 4] != (char *)0x0) {
    *(undefined4 *)in_R8[(long)in_ESI * 6 + 4] = uVar4;
  }
  return 0;
}

Assistant:

int
zt_opt_bool_int(int argn, int defn, int * argc, char ** argv, zt_opt_def_t * def, zt_opt_error error) {
    int    result;
    size_t len;
    int    args_consumed = 0;
    char * arg = zt_opt_get_value(argn, defn, argv, def, &args_consumed, error);

    len = strlen(arg);

    if (len == 1) {
        switch (*arg) {
            case 't':
            case 'T':
            case 'y':
            case 'Y':
                result = 1;
                break;
            case 'f':
            case 'F':
            case 'n':
            case 'N':
                result = 0;
                break;
            default:
                error(EINVAL, "'%s' is not a boolean expression", argv[argn]);
                return 0;
        }
    } else {
        if (strcasecmp(arg, "true") == 0 ||
            strcasecmp(arg, "yes") == 0) {
            result = 1;
        } else if (strcasecmp(arg, "false") == 0 ||
                   strcasecmp(arg, "no") == 0) {
            result = 0;
        } else {
            error(EINVAL, "'%s' is not a boolean expression", argv[argn]);
            return 0;
        }
    }

    if (def[defn].cb_data) {
        *(int *)def[defn].cb_data = result;
    }

    return args_consumed;
}